

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

void Catch::cleanUp(void)

{
  anon_unknown_27::getTheRegistryHub();
  if (anon_unknown_27::getTheRegistryHub::theRegistryHub != (RegistryHub *)0x0) {
    (*(anon_unknown_27::getTheRegistryHub::theRegistryHub->super_IRegistryHub)._vptr_IRegistryHub[1]
    )();
  }
  anon_unknown_27::getTheRegistryHub();
  anon_unknown_27::getTheRegistryHub::theRegistryHub = (RegistryHub *)0x0;
  cleanUpContext();
  return;
}

Assistant:

void cleanUp() {
        delete getTheRegistryHub();
        getTheRegistryHub() = NULL;
        cleanUpContext();
    }